

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

double __thiscall llvm::FileError::log(FileError *this,double __x)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  raw_ostream *prVar4;
  unsigned_long *puVar5;
  pointer pEVar6;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  raw_ostream *OS_local;
  FileError *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Err);
  bVar2 = false;
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    bVar2 = false;
    if ((uVar3 & 1) == 0) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    prVar4 = raw_ostream::operator<<(in_RSI,"\'");
    prVar4 = raw_ostream::operator<<(prVar4,&this->FileName);
    raw_ostream::operator<<(prVar4,"\': ");
    bVar2 = Optional<unsigned_long>::hasValue(&this->Line);
    if (bVar2) {
      prVar4 = raw_ostream::operator<<(in_RSI,"line ");
      puVar5 = Optional<unsigned_long>::getValue(&this->Line);
      prVar4 = raw_ostream::operator<<(prVar4,*puVar5);
      raw_ostream::operator<<(prVar4,": ");
    }
    pEVar6 = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
             operator->(&this->Err);
    (*pEVar6->_vptr_ErrorInfoBase[2])(pEVar6,in_RSI);
    return extraout_XMM0_Qa;
  }
  __assert_fail("Err && !FileName.empty() && \"Trying to log after takeError().\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                ,0x4cc,"virtual void llvm::FileError::log(raw_ostream &) const");
}

Assistant:

void log(raw_ostream &OS) const override {
    assert(Err && !FileName.empty() && "Trying to log after takeError().");
    OS << "'" << FileName << "': ";
    if (Line.hasValue())
      OS << "line " << Line.getValue() << ": ";
    Err->log(OS);
  }